

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

bool leveldb::GetVarint32(Slice *input,uint32_t *value)

{
  uint32_t *value_00;
  size_t sVar1;
  char *d;
  Slice *in_RDI;
  char *q;
  char *limit;
  char *p;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  value_00 = (uint32_t *)Slice::data(in_RDI);
  sVar1 = Slice::size(in_RDI);
  d = GetVarint32Ptr(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,value_00);
  if (d != (char *)0x0) {
    Slice::Slice((Slice *)&stack0xffffffffffffffc0,d,(long)value_00 + (sVar1 - (long)d));
    in_RDI->data_ = in_stack_ffffffffffffffc0;
    in_RDI->size_ = (size_t)in_stack_ffffffffffffffc8;
  }
  return d != (char *)0x0;
}

Assistant:

bool GetVarint32(Slice* input, uint32_t* value) {
  const char* p = input->data();
  const char* limit = p + input->size();
  const char* q = GetVarint32Ptr(p, limit, value);
  if (q == nullptr) {
    return false;
  } else {
    *input = Slice(q, limit - q);
    return true;
  }
}